

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O0

size_t vk::getLiveSystemAllocationTotal(AllocationCallbackValidationResults *validationResults)

{
  bool bVar1;
  pointer pAVar2;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  int internalAllocationScopeNdx;
  int internalAllocationTypeNdx;
  size_t alignment;
  size_t size;
  __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
  local_20;
  const_iterator alloc;
  size_t allocationTotal;
  AllocationCallbackValidationResults *validationResults_local;
  
  alloc._M_current = (AllocationCallbackRecord *)0x0;
  local_20._M_current =
       (AllocationCallbackRecord *)
       std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>::
       begin(&validationResults->liveAllocations);
  while( true ) {
    size = (size_t)std::
                   vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>
                   ::end(&validationResults->liveAllocations);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
                        *)&size);
    if (!bVar1) break;
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
             ::operator->(&local_20);
    if (pAVar2->type == TYPE_ALLOCATION) {
      pAVar2 = __gnu_cxx::
               __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
               ::operator->(&local_20);
      local_48 = (pAVar2->data).reallocation.original;
    }
    else {
      pAVar2 = __gnu_cxx::
               __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
               ::operator->(&local_20);
      local_48 = (void *)(pAVar2->data).allocation.alignment;
    }
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
             ::operator->(&local_20);
    if (pAVar2->type == TYPE_ALLOCATION) {
      pAVar2 = __gnu_cxx::
               __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
               ::operator->(&local_20);
      local_50 = (pAVar2->data).allocation.alignment;
    }
    else {
      pAVar2 = __gnu_cxx::
               __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
               ::operator->(&local_20);
      local_50 = (pAVar2->data).reallocation.alignment;
    }
    alloc._M_current =
         (long)local_48 + (local_50 - (long)(int)(uint)(local_50 != 0)) + alloc._M_current;
    __gnu_cxx::
    __normal_iterator<const_vk::AllocationCallbackRecord_*,_std::vector<vk::AllocationCallbackRecord,_std::allocator<vk::AllocationCallbackRecord>_>_>
    ::operator++(&local_20);
  }
  for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
      alloc._M_current =
           (AllocationCallbackRecord *)
           ((long)&(alloc._M_current)->type +
           validationResults->internalAllocationTotal[local_3c][local_40]);
    }
  }
  return (size_t)alloc._M_current;
}

Assistant:

size_t getLiveSystemAllocationTotal (const AllocationCallbackValidationResults& validationResults)
{
	size_t	allocationTotal	= 0;

	DE_ASSERT(validationResults.violations.empty());

	for (std::vector<AllocationCallbackRecord>::const_iterator alloc = validationResults.liveAllocations.begin();
		 alloc != validationResults.liveAllocations.end();
		 ++alloc)
	{
		DE_ASSERT(alloc->type == AllocationCallbackRecord::TYPE_ALLOCATION ||
				  alloc->type == AllocationCallbackRecord::TYPE_REALLOCATION);

		const size_t	size		= (alloc->type == AllocationCallbackRecord::TYPE_ALLOCATION ? alloc->data.allocation.size : alloc->data.reallocation.size);
		const size_t	alignment	= (alloc->type == AllocationCallbackRecord::TYPE_ALLOCATION ? alloc->data.allocation.alignment : alloc->data.reallocation.alignment);

		allocationTotal += size + alignment - (alignment > 0 ? 1 : 0);
	}

	for (int internalAllocationTypeNdx = 0; internalAllocationTypeNdx < VK_INTERNAL_ALLOCATION_TYPE_LAST; ++internalAllocationTypeNdx)
	{
		for (int internalAllocationScopeNdx = 0; internalAllocationScopeNdx < VK_SYSTEM_ALLOCATION_SCOPE_LAST; ++internalAllocationScopeNdx)
			allocationTotal += validationResults.internalAllocationTotal[internalAllocationTypeNdx][internalAllocationScopeNdx];
	}

	return allocationTotal;
}